

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileBacktrace::PrintCallStack(cmListFileBacktrace *this,ostream *out)

{
  bool bVar1;
  cmState *pcVar2;
  char *pcVar3;
  ostream *os;
  Entry *pEVar4;
  cmOutputConverter converter;
  cmListFileContext lfc;
  allocator local_e1;
  ostream *local_e0;
  string local_d8;
  cmOutputConverter local_b8;
  cmListFileContext local_98;
  string local_50;
  
  if ((this->Cur != (Entry *)0x0) && (this->Cur->Up != (Entry *)0x0)) {
    cmOutputConverter::cmOutputConverter(&local_b8,&this->Bottom);
    pEVar4 = this->Cur;
    bVar1 = true;
    while (pEVar4 = pEVar4->Up, pEVar4 != (Entry *)0x0) {
      if ((pEVar4->super_cmListFileContext).Name._M_string_length != 0) {
        if (bVar1) {
          std::operator<<(out,"Call Stack (most recent call first):\n");
        }
        local_e0 = out;
        cmListFileContext::cmListFileContext(&local_98,&pEVar4->super_cmListFileContext);
        pcVar2 = cmStateSnapshot::GetState(&this->Bottom);
        bVar1 = cmState::GetIsInTryCompile(pcVar2);
        if (!bVar1) {
          pcVar2 = cmStateSnapshot::GetState(&this->Bottom);
          pcVar3 = cmState::GetSourceDirectory(pcVar2);
          std::__cxx11::string::string((string *)&local_d8,pcVar3,&local_e1);
          cmOutputConverter::ConvertToRelativePath(&local_50,&local_b8,&local_d8,&local_98.FilePath)
          ;
          std::__cxx11::string::operator=((string *)&local_98.FilePath,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        os = std::operator<<(local_e0,"  ");
        operator<<(os,&local_98);
        std::operator<<(os,"\n");
        cmListFileContext::~cmListFileContext(&local_98);
        bVar1 = false;
        out = local_e0;
      }
    }
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintCallStack(std::ostream& out) const
{
  if (!this->Cur || !this->Cur->Up) {
    return;
  }

  bool first = true;
  cmOutputConverter converter(this->Bottom);
  for (Entry* i = this->Cur->Up; i; i = i->Up) {
    if (i->Name.empty()) {
      // Skip this whole-file scope.  When we get here we already will
      // have printed a more-specific context within the file.
      continue;
    }
    if (first) {
      first = false;
      out << "Call Stack (most recent call first):\n";
    }
    cmListFileContext lfc = *i;
    if (!this->Bottom.GetState()->GetIsInTryCompile()) {
      lfc.FilePath = converter.ConvertToRelativePath(
        this->Bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
    }
    out << "  " << lfc << "\n";
  }
}